

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

ostream * __thiscall LogImpl::get_stream(LogImpl *this)

{
  LogImpl *this_local;
  
  if (this->m_stream == StdOut) {
    this_local = (LogImpl *)&std::cout;
  }
  else if (this->m_stream == StdErr) {
    this_local = (LogImpl *)&std::cerr;
  }
  else {
    this_local = (LogImpl *)&this->m_ofstream;
  }
  return (ostream *)this_local;
}

Assistant:

std::ostream& get_stream()
    {
        switch (m_stream) {
        case Stream::StdOut:
            return std::cout;
        case Stream::StdErr:
            return std::cerr;
        default:
            return m_ofstream;
        }
    }